

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

depth_first_traverser * __thiscall
clipp::group::depth_first_traverser::back_to_ancestor(depth_first_traverser *this,group *g)

{
  bool bVar1;
  reference pvVar2;
  pointer pcVar3;
  group *pgVar4;
  const_iterator *top;
  group *g_local;
  depth_first_traverser *this_local;
  
  if (g != (group *)0x0) {
    while (bVar1 = std::
                   vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ::empty(&this->stack_), ((bVar1 ^ 0xffU) & 1) != 0) {
      pvVar2 = std::
               vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
               ::back(&this->stack_);
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
               ::operator->(&pvVar2->cur);
      bVar1 = child_t<clipp::parameter,_clipp::group>::is_group(pcVar3);
      if (bVar1) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                 ::operator->(&pvVar2->cur);
        pgVar4 = child_t<clipp::parameter,_clipp::group>::as_group(pcVar3);
        if (pgVar4 == g) {
          return this;
        }
      }
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::pop_back(&this->stack_);
    }
  }
  return this;
}

Assistant:

depth_first_traverser&
        back_to_ancestor(const group* g) {
            if(!g) return *this;
            while(!stack_.empty()) {
                const auto& top = stack_.back().cur;
                if(top->is_group() && &(top->as_group()) == g) return *this;
                stack_.pop_back();
            }
            return *this;
        }